

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O2

man_page *
clipp::make_man_page
          (man_page *__return_storage_ptr__,group *cli,doc_string *progname,doc_formatting *fmt)

{
  allocator local_681;
  param_filter local_680;
  filter_function local_658;
  string local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  string local_5f8;
  string local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  documentation local_598;
  
  __return_storage_ptr__->sectionSpc_ = 1;
  (__return_storage_ptr__->sections_).
  super__Vector_base<clipp::man_page::section,_std::allocator<clipp::man_page::section>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->sections_).
  super__Vector_base<clipp::man_page::section,_std::allocator<clipp::man_page::section>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->sections_).
  super__Vector_base<clipp::man_page::section,_std::allocator<clipp::man_page::section>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->progName_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->progName_).field_2;
  (__return_storage_ptr__->progName_)._M_string_length = 0;
  (__return_storage_ptr__->progName_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_5b8,"SYNOPSIS",(allocator *)&local_680);
  std::__cxx11::string::string((string *)&local_5f8,(string *)progname);
  usage_lines::usage_lines((usage_lines *)&local_598,cli,&local_5f8,fmt);
  usage_lines::str_abi_cxx11_(&local_5d8,(usage_lines *)&local_598);
  std::vector<clipp::man_page::section,std::allocator<clipp::man_page::section>>::
  emplace_back<std::__cxx11::string,std::__cxx11::string>
            ((vector<clipp::man_page::section,std::allocator<clipp::man_page::section>> *)
             &__return_storage_ptr__->sections_,&local_5b8,&local_5d8);
  std::__cxx11::string::~string((string *)&local_5d8);
  usage_lines::~usage_lines((usage_lines *)&local_598);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::__cxx11::string::string((string *)&local_618,"OPTIONS",&local_681);
  local_680.prefix_._M_dataplus._M_p = (pointer)&local_680.prefix_.field_2;
  local_680.prefix_.field_2._M_allocated_capacity = 0;
  local_680.prefix_.field_2._8_8_ = 0;
  local_680.prefix_._M_string_length = 0;
  local_680.required_ = either;
  local_680.blocking_ = either;
  local_680.repeatable_ = either;
  local_680.hasDoc_ = yes;
  local_680._36_4_ = 0;
  std::function<bool(clipp::parameter_const&)>::function<clipp::param_filter,void>
            ((function<bool(clipp::parameter_const&)> *)&local_658,&local_680);
  documentation::documentation(&local_598,cli,fmt,&local_658);
  documentation::str_abi_cxx11_(&local_638,&local_598);
  std::vector<clipp::man_page::section,std::allocator<clipp::man_page::section>>::
  emplace_back<std::__cxx11::string,std::__cxx11::string>
            ((vector<clipp::man_page::section,std::allocator<clipp::man_page::section>> *)
             &__return_storage_ptr__->sections_,&local_618,&local_638);
  std::__cxx11::string::~string((string *)&local_638);
  documentation::~documentation(&local_598);
  std::_Function_base::~_Function_base(&local_658.super__Function_base);
  std::__cxx11::string::~string((string *)&local_680);
  std::__cxx11::string::~string((string *)&local_618);
  return __return_storage_ptr__;
}

Assistant:

inline man_page
make_man_page(const group& cli,
              doc_string progname = "",
              const doc_formatting& fmt = doc_formatting{})
{
    man_page man;
    man.append_section("SYNOPSIS", usage_lines(cli,progname,fmt).str());
    man.append_section("OPTIONS", documentation(cli,fmt).str());
    return man;
}